

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean save_marker(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_marker_reader *pjVar2;
  jpeg_source_mgr *pjVar3;
  boolean bVar4;
  uint uVar5;
  jpeg_saved_marker_ptr local_68;
  jpeg_saved_marker_ptr prev;
  size_t sStack_58;
  uint limit;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  INT32 length;
  JOCTET *data;
  uint data_length;
  uint bytes_read;
  jpeg_saved_marker_ptr cur_marker;
  my_marker_ptr marker;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->marker;
  _data_length = (jpeg_saved_marker_ptr)pjVar2[6].read_markers;
  datasrc = (jpeg_source_mgr *)0x0;
  pjVar3 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar3->next_input_byte;
  sStack_58 = pjVar3->bytes_in_buffer;
  if (_data_length == (jpeg_saved_marker_ptr)0x0) {
    if (sStack_58 == 0) {
      bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar4 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      sStack_58 = pjVar3->bytes_in_buffer;
    }
    sStack_58 = sStack_58 - 1;
    bVar1 = *(byte *)bytes_in_buffer;
    bytes_in_buffer = bytes_in_buffer + 1;
    if (sStack_58 == 0) {
      bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar4 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      sStack_58 = pjVar3->bytes_in_buffer;
    }
    sStack_58 = sStack_58 - 1;
    datasrc = (jpeg_source_mgr *)((ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100 + -2);
    if ((long)datasrc < 0) {
      data._0_4_ = 0;
      length = 0;
    }
    else {
      if (cinfo->unread_marker == 0xfe) {
        prev._4_4_ = *(uint *)&pjVar2[4].read_restart_marker;
      }
      else {
        prev._4_4_ = *(uint *)((long)&pjVar2[4].read_restart_marker +
                              (long)(cinfo->unread_marker + -0xe0) * 4 + 4);
      }
      uVar5 = (uint)datasrc;
      if (uVar5 < prev._4_4_) {
        prev._4_4_ = uVar5;
      }
      _data_length = (jpeg_saved_marker_ptr)
                     (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,(ulong)prev._4_4_ + 0x20);
      _data_length->next = (jpeg_saved_marker_ptr)0x0;
      _data_length->marker = (UINT8)SUB41(cinfo->unread_marker,0);
      _data_length->original_length = uVar5;
      _data_length->data_length = prev._4_4_;
      length = (INT32)(_data_length + 1);
      _data_length->data = (JOCTET *)length;
      pjVar2[6].read_markers = (_func_int_j_decompress_ptr *)_data_length;
      *(undefined4 *)&pjVar2[6].read_restart_marker = 0;
      data._0_4_ = prev._4_4_;
    }
    data._4_4_ = 0;
    bytes_in_buffer = bytes_in_buffer + 1;
  }
  else {
    data._4_4_ = *(uint *)&pjVar2[6].read_restart_marker;
    data._0_4_ = _data_length->data_length;
    length = (INT32)(_data_length->data + data._4_4_);
  }
  do {
    if ((uint)data <= data._4_4_) {
      if (_data_length != (jpeg_saved_marker_ptr)0x0) {
        if (cinfo->marker_list == (jpeg_saved_marker_ptr)0x0) {
          cinfo->marker_list = _data_length;
        }
        else {
          for (local_68 = cinfo->marker_list; local_68->next != (jpeg_saved_marker_ptr)0x0;
              local_68 = local_68->next) {
          }
          local_68->next = _data_length;
        }
        length = (INT32)_data_length->data;
        datasrc = (jpeg_source_mgr *)(ulong)(_data_length->original_length - (uint)data);
      }
      pjVar2[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
      if (cinfo->unread_marker == 0xe0) {
        examine_app0(cinfo,(JOCTET *)length,(uint)data,(INT32)datasrc);
      }
      else if (cinfo->unread_marker == 0xee) {
        examine_app14(cinfo,(JOCTET *)length,(uint)data,(INT32)datasrc);
      }
      else {
        cinfo->err->msg_code = 0x5d;
        (cinfo->err->msg_parm).i[0] = cinfo->unread_marker;
        (cinfo->err->msg_parm).i[1] = (uint)data + (int)datasrc;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
      pjVar3->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar3->bytes_in_buffer = sStack_58;
      if (0 < (long)datasrc) {
        (*cinfo->src->skip_input_data)(cinfo,(long)datasrc);
      }
      return 1;
    }
    pjVar3->next_input_byte = (JOCTET *)bytes_in_buffer;
    pjVar3->bytes_in_buffer = sStack_58;
    *(uint *)&pjVar2[6].read_restart_marker = data._4_4_;
    if (sStack_58 == 0) {
      bVar4 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar4 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      sStack_58 = pjVar3->bytes_in_buffer;
    }
    for (; data._4_4_ < (uint)data && sStack_58 != 0; data._4_4_ = data._4_4_ + 1) {
      *(undefined1 *)length = *(undefined1 *)bytes_in_buffer;
      sStack_58 = sStack_58 - 1;
      bytes_in_buffer = bytes_in_buffer + 1;
      length = length + 1;
    }
  } while( true );
}

Assistant:

METHODDEF(boolean)
save_marker (j_decompress_ptr cinfo)
/* Save an APPn or COM marker into the marker list */
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;
  jpeg_saved_marker_ptr cur_marker = marker->cur_marker;
  unsigned int bytes_read, data_length;
  JOCTET FAR * data;
  INT32 length = 0;
  INPUT_VARS(cinfo);

  if (cur_marker == NULL) {
    /* begin reading a marker */
    INPUT_2BYTES(cinfo, length, return FALSE);
    length -= 2;
    if (length >= 0) {		/* watch out for bogus length word */
      /* figure out how much we want to save */
      unsigned int limit;
      if (cinfo->unread_marker == (int) M_COM)
	limit = marker->length_limit_COM;
      else
	limit = marker->length_limit_APPn[cinfo->unread_marker - (int) M_APP0];
      if ((unsigned int) length < limit)
	limit = (unsigned int) length;
      /* allocate and initialize the marker item */
      cur_marker = (jpeg_saved_marker_ptr)
	(*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				    SIZEOF(struct jpeg_marker_struct) + limit);
      cur_marker->next = NULL;
      cur_marker->marker = (UINT8) cinfo->unread_marker;
      cur_marker->original_length = (unsigned int) length;
      cur_marker->data_length = limit;
      /* data area is just beyond the jpeg_marker_struct */
      data = cur_marker->data = (JOCTET FAR *) (cur_marker + 1);
      marker->cur_marker = cur_marker;
      marker->bytes_read = 0;
      bytes_read = 0;
      data_length = limit;
    } else {
      /* deal with bogus length word */
      bytes_read = data_length = 0;
      data = NULL;
    }
  } else {
    /* resume reading a marker */
    bytes_read = marker->bytes_read;
    data_length = cur_marker->data_length;
    data = cur_marker->data + bytes_read;
  }

  while (bytes_read < data_length) {
    INPUT_SYNC(cinfo);		/* move the restart point to here */
    marker->bytes_read = bytes_read;
    /* If there's not at least one byte in buffer, suspend */
    MAKE_BYTE_AVAIL(cinfo, return FALSE);
    /* Copy bytes with reasonable rapidity */
    while (bytes_read < data_length && bytes_in_buffer > 0) {
      *data++ = *next_input_byte++;
      bytes_in_buffer--;
      bytes_read++;
    }
  }

  /* Done reading what we want to read */
  if (cur_marker != NULL) {	/* will be NULL if bogus length word */
    /* Add new marker to end of list */
    if (cinfo->marker_list == NULL) {
      cinfo->marker_list = cur_marker;
    } else {
      jpeg_saved_marker_ptr prev = cinfo->marker_list;
      while (prev->next != NULL)
	prev = prev->next;
      prev->next = cur_marker;
    }
    /* Reset pointer & calc remaining data length */
    data = cur_marker->data;
    length = cur_marker->original_length - data_length;
  }
  /* Reset to initial state for next marker */
  marker->cur_marker = NULL;

  /* Process the marker if interesting; else just make a generic trace msg */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, data, data_length, length);
    break;
  case M_APP14:
    examine_app14(cinfo, data, data_length, length);
    break;
  default:
    TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker,
	     (int) (data_length + length));
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);		/* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}